

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O1

wchar_t chance_of_spell_hit(monster_conflict *mon,monster_spell *spell)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  
  wVar3 = mon->race->level;
  iVar4 = 3;
  if (L'\0' < wVar3) {
    iVar4 = wVar3 * 3;
  }
  wVar3 = iVar4 + spell->hit;
  wVar1 = monster_effect_level((monster *)mon,L'\x02');
  if (L'\0' < wVar1) {
    wVar1 = L'\0';
    do {
      wVar3 = (wVar3 * 0x50) / 100;
      wVar1 = wVar1 + L'\x01';
      wVar2 = monster_effect_level((monster *)mon,L'\x02');
    } while (wVar1 < wVar2);
  }
  return wVar3;
}

Assistant:

static int chance_of_spell_hit(const struct monster *mon,
	const struct monster_spell *spell)
{
	int to_hit = chance_of_spell_hit_base(mon->race, spell);

	/* Apply confusion hit reduction for each level of confusion */
	for (int i = 0; i < monster_effect_level(mon, MON_TMD_CONF); i++) {
		to_hit = to_hit * (100 - CONF_HIT_REDUCTION) / 100;
	}

	return to_hit;
}